

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O1

void __thiscall
XPMP2::SocketNetworking::Open
          (SocketNetworking *this,string *_addr,int _port,size_t _bufSize,uint _timeOut_ms,
          bool _bBroadcast)

{
  string *__rhs;
  uint uVar1;
  uint __val;
  SocketNetworking *this_00;
  uint uVar2;
  int iVar3;
  NetRuntimeError *pNVar4;
  long *plVar5;
  uint uVar6;
  char *pcVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __len;
  addrinfo *addrinfo;
  int setToVal;
  string decimal_port;
  addrinfo hints;
  timeval timeout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  addrinfo *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined4 local_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  SocketNetworking *local_88;
  size_t local_80;
  addrinfo local_78;
  ulong local_40;
  ulong local_38;
  
  local_f8 = (addrinfo *)0x0;
  this->f_port = _port;
  __rhs = &this->f_addr;
  local_88 = this;
  local_80 = _bufSize;
  std::__cxx11::string::_M_assign((string *)__rhs);
  uVar1 = this->f_port;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00230793;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00230793;
      }
      if (uVar6 < 10000) goto LAB_00230793;
      uVar9 = uVar9 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_00230793:
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_a8,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_a8._M_dataplus._M_p + (uVar1 >> 0x1f),__len,__val);
  this_00 = local_88;
  local_78.ai_canonname = (char *)0x0;
  local_78.ai_next = (addrinfo *)0x0;
  local_78.ai_addrlen = 0;
  local_78._20_4_ = 0;
  local_78.ai_addr = (sockaddr *)0x0;
  local_78.ai_flags = 0;
  local_78.ai_family = 0;
  local_78.ai_socktype = 0;
  local_78.ai_protocol = 0;
  (*local_88->_vptr_SocketNetworking[6])(local_88);
  if ((this_00->f_addr)._M_string_length == 0) {
    pcVar7 = "0.0.0.0";
    if (local_78.ai_family == 10) {
      pcVar7 = "::";
    }
    std::__cxx11::string::_M_replace((ulong)__rhs,0,(char *)0x0,(ulong)pcVar7);
  }
  iVar3 = getaddrinfo((__rhs->_M_dataplus)._M_p,local_a8._M_dataplus._M_p,&local_78,&local_f8);
  if ((iVar3 != 0) || (local_f8 == (addrinfo *)0x0)) {
    pNVar4 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_f0,"invalid address or port for socket: \"",__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_138._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_138._M_dataplus._M_p == psVar8) {
      local_138.field_2._M_allocated_capacity = *psVar8;
      local_138.field_2._8_8_ = plVar5[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar8;
    }
    local_138._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::operator+(&local_d0,&local_138,&local_a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_118._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_118._M_dataplus._M_p == psVar8) {
      local_118.field_2._M_allocated_capacity = *psVar8;
      local_118.field_2._8_8_ = plVar5[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar8;
    }
    local_118._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    NetRuntimeError::NetRuntimeError(pNVar4,&local_118);
    __cxa_throw(pNVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  iVar3 = socket(local_f8->ai_family,local_f8->ai_socktype,local_f8->ai_protocol);
  this_00->f_socket = iVar3;
  if (iVar3 == -1) {
    pNVar4 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_f0,"could not create socket for: \"",__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_138._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_138._M_dataplus._M_p == psVar8) {
      local_138.field_2._M_allocated_capacity = *psVar8;
      local_138.field_2._8_8_ = plVar5[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar8;
    }
    local_138._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::operator+(&local_d0,&local_138,&local_a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_118._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_118._M_dataplus._M_p == psVar8) {
      local_118.field_2._M_allocated_capacity = *psVar8;
      local_118.field_2._8_8_ = plVar5[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar8;
    }
    local_118._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    NetRuntimeError::NetRuntimeError(pNVar4,&local_118);
    __cxa_throw(pNVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  local_ac = 1;
  iVar3 = setsockopt(iVar3,1,2,&local_ac,4);
  if (iVar3 < 0) {
    pNVar4 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_f0,"could not setsockopt SO_REUSEADDR for: \"",__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_138._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_138._M_dataplus._M_p == psVar8) {
      local_138.field_2._M_allocated_capacity = *psVar8;
      local_138.field_2._8_8_ = plVar5[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar8;
    }
    local_138._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::operator+(&local_d0,&local_138,&local_a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_118._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_118._M_dataplus._M_p == psVar8) {
      local_118.field_2._M_allocated_capacity = *psVar8;
      local_118.field_2._8_8_ = plVar5[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar8;
    }
    local_118._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    NetRuntimeError::NetRuntimeError(pNVar4,&local_118);
    __cxa_throw(pNVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  iVar3 = setsockopt(this_00->f_socket,1,0xf,&local_ac,4);
  if (iVar3 < 0) {
    pNVar4 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_f0,"could not setsockopt SO_REUSEPORT for: \"",__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_138._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_138._M_dataplus._M_p == psVar8) {
      local_138.field_2._M_allocated_capacity = *psVar8;
      local_138.field_2._8_8_ = plVar5[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar8;
    }
    local_138._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::operator+(&local_d0,&local_138,&local_a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_118._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_118._M_dataplus._M_p == psVar8) {
      local_118.field_2._M_allocated_capacity = *psVar8;
      local_118.field_2._8_8_ = plVar5[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar8;
    }
    local_118._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    NetRuntimeError::NetRuntimeError(pNVar4,&local_118);
    __cxa_throw(pNVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  local_40 = (ulong)_timeOut_ms / 1000;
  local_38 = (ulong)((_timeOut_ms % 1000) * 1000);
  iVar3 = setsockopt(this_00->f_socket,1,0x14,&local_40,0x10);
  if (iVar3 < 0) {
    pNVar4 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_f0,"could not setsockopt SO_RCVTIMEO for: \"",__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_138._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_138._M_dataplus._M_p == psVar8) {
      local_138.field_2._M_allocated_capacity = *psVar8;
      local_138.field_2._8_8_ = plVar5[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar8;
    }
    local_138._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::operator+(&local_d0,&local_138,&local_a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_118._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_118._M_dataplus._M_p == psVar8) {
      local_118.field_2._M_allocated_capacity = *psVar8;
      local_118.field_2._8_8_ = plVar5[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar8;
    }
    local_118._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    NetRuntimeError::NetRuntimeError(pNVar4,&local_118);
    __cxa_throw(pNVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  if (_bBroadcast) {
    local_ac = 1;
    iVar3 = setsockopt(this_00->f_socket,1,6,&local_ac,4);
    if (iVar3 < 0) {
      pNVar4 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      std::operator+(&local_f0,"could not setsockopt SO_BROADCAST for: \"",__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_138._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_138._M_dataplus._M_p == psVar8) {
        local_138.field_2._M_allocated_capacity = *psVar8;
        local_138.field_2._8_8_ = plVar5[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar8;
      }
      local_138._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::operator+(&local_d0,&local_138,&local_a8);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_118._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_118._M_dataplus._M_p == psVar8) {
        local_118.field_2._M_allocated_capacity = *psVar8;
        local_118.field_2._8_8_ = plVar5[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar8;
      }
      local_118._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      NetRuntimeError::NetRuntimeError(pNVar4,&local_118);
      __cxa_throw(pNVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
    }
  }
  iVar3 = bind(this_00->f_socket,local_f8->ai_addr,local_f8->ai_addrlen);
  if (iVar3 == 0) {
    freeaddrinfo(local_f8);
    local_f8 = (addrinfo *)0x0;
    SetBufSize(this_00,local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  pNVar4 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_f0,"could not bind UDP socket with: \"",__rhs);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_138._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_138._M_dataplus._M_p == psVar8) {
    local_138.field_2._M_allocated_capacity = *psVar8;
    local_138.field_2._8_8_ = plVar5[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar8;
  }
  local_138._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::operator+(&local_d0,&local_138,&local_a8);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_118._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_118._M_dataplus._M_p == psVar8) {
    local_118.field_2._M_allocated_capacity = *psVar8;
    local_118.field_2._8_8_ = plVar5[3];
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar8;
  }
  local_118._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  NetRuntimeError::NetRuntimeError(pNVar4,&local_118);
  __cxa_throw(pNVar4,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
}

Assistant:

void SocketNetworking::Open(const std::string& _addr, int _port,
                       size_t _bufSize, unsigned _timeOut_ms, bool _bBroadcast)
{
    struct addrinfo *   addrinfo      = NULL;
    try {
        // store member values
        f_port = _port;
        f_addr = _addr;
        const std::string decimal_port(std::to_string(f_port));

        // get a valid address based on inAddr/port
        struct addrinfo hints;
        memset(&hints, 0, sizeof(hints));
        GetAddrHints(hints);            // ask subclasses
        
        // Any address?
        if (f_addr.empty())
            f_addr = hints.ai_family == AF_INET6 ? "::" : "0.0.0.0";
        
        // Need to get
        int r = getaddrinfo(f_addr.c_str(),
                            decimal_port.c_str(), &hints, &addrinfo);
        if(r != 0 || addrinfo == NULL)
            throw NetRuntimeError("invalid address or port for socket: \"" + f_addr + ":" + decimal_port + "\"");
        
        // get a socket
        f_socket = socket(addrinfo->ai_family, addrinfo->ai_socktype, addrinfo->ai_protocol);
        if(f_socket == INVALID_SOCKET)
            throw NetRuntimeError("could not create socket for: \"" + f_addr + ":" + decimal_port + "\"");
        
        // Reuse address and port to allow others to connect, too
        int setToVal = 1;
#if IBM
        if (setsockopt(f_socket, SOL_SOCKET, SO_REUSEADDR, (char*)&setToVal, sizeof(setToVal)) < 0)
            throw NetRuntimeError("could not setsockopt SO_REUSEADDR for: \"" + f_addr + ":" + decimal_port + "\"");
#else
        if (setsockopt(f_socket, SOL_SOCKET, SO_REUSEADDR, &setToVal, sizeof(setToVal)) < 0)
            throw NetRuntimeError("could not setsockopt SO_REUSEADDR for: \"" + f_addr + ":" + decimal_port + "\"");
        if (setsockopt(f_socket, SOL_SOCKET, SO_REUSEPORT, &setToVal, sizeof(setToVal)) < 0)
            throw NetRuntimeError("could not setsockopt SO_REUSEPORT for: \"" + f_addr + ":" + decimal_port + "\"");
#endif

        // define receive timeout
#if IBM
        DWORD wsTimeout = _timeOut_ms;
        if (setsockopt(f_socket, SOL_SOCKET, SO_RCVTIMEO, (char*)&wsTimeout, sizeof(wsTimeout)) < 0)
            throw NetRuntimeError("could not setsockopt SO_RCVTIMEO for: \"" + f_addr + ":" + decimal_port + "\"");
#else
        struct timeval timeout;
        timeout.tv_sec = _timeOut_ms / 1000;
        timeout.tv_usec = (_timeOut_ms % 1000) * 1000;
        if (setsockopt(f_socket, SOL_SOCKET, SO_RCVTIMEO, &timeout, sizeof(timeout)) < 0)
            throw NetRuntimeError("could not setsockopt SO_RCVTIMEO for: \"" + f_addr + ":" + decimal_port + "\"");
#endif
        
        // if requested allow for sending broadcasts
        if (_bBroadcast) {
            setToVal = 1;
#if IBM
            if (setsockopt(f_socket, SOL_SOCKET, SO_BROADCAST, (char*)&setToVal, sizeof(setToVal)) < 0)
                throw NetRuntimeError("could not setsockopt SO_BROADCAST for: \"" + f_addr + ":" + decimal_port + "\"");
#else
            if (setsockopt(f_socket, SOL_SOCKET, SO_BROADCAST, &setToVal, sizeof(setToVal)) < 0)
                throw NetRuntimeError("could not setsockopt SO_BROADCAST for: \"" + f_addr + ":" + decimal_port + "\"");
#endif
        }

        // bind the socket to the address:port
        r = bind(f_socket, addrinfo->ai_addr, (socklen_t)addrinfo->ai_addrlen);
        if(r != 0)
            throw NetRuntimeError("could not bind UDP socket with: \"" + f_addr + ":" + decimal_port + "\"");

        // free adress info
        freeaddrinfo(addrinfo);
        addrinfo = NULL;

        // reserve receive buffer
        SetBufSize(_bufSize);
    }
    catch (...) {
        // free adress info
        if (addrinfo) {
            freeaddrinfo(addrinfo);
            addrinfo = NULL;
        }
        // make sure everything is closed
        Close();
        // re-throw
        throw;
    }
}